

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.c
# Opt level: O0

int testTerritoryCode(void)

{
  Territory TVar1;
  Territory ccode;
  Territory result;
  int i;
  int nrTests;
  
  result = TERRITORY_UNKNOWN;
  for (ccode = TERRITORY_UNKNOWN; ccode < 0x10; ccode = ccode + 1) {
    TVar1 = getParentCountryOf(testTerritoryCode::ptcTestData[ccode].input);
    if (TVar1 != testTerritoryCode::ptcTestData[ccode].output) {
      foundError();
      printf("*** ERROR *** getParentCountryOf(%d) returned unexpected %d\n",
             (ulong)(uint)testTerritoryCode::ptcTestData[ccode].input,(ulong)(uint)TVar1);
    }
  }
  ccode = TERRITORY_UNKNOWN;
  while (testTerritoryCode::tcTestData[ccode].inputstring != (char *)0x0) {
    TVar1 = getTerritoryCode(testTerritoryCode::tcTestData[ccode].inputstring,
                             testTerritoryCode::tcTestData[ccode].context);
    result = result + 1;
    if (TVar1 != testTerritoryCode::tcTestData[ccode].expectedresult) {
      foundError();
      printf("*** ERROR *** getTerritoryCode(\"%s\", %d)=%d, expected %d\n",
             testTerritoryCode::tcTestData[ccode].inputstring,
             (ulong)(uint)testTerritoryCode::tcTestData[ccode].context,(ulong)(uint)TVar1,
             (ulong)(uint)testTerritoryCode::tcTestData[ccode].expectedresult);
    }
    ccode = ccode + 1;
  }
  return result;
}

Assistant:

static int testTerritoryCode(void) {
    int nrTests = 0;
    int i;

    static const struct {
        enum Territory expectedresult;
        enum Territory context;
        const char *inputstring;
    } tcTestData[] = {
            {TERRITORY_RU_AL, TERRITORY_RU_TT, "AL"}, // 431=ru-tam
            {TERRITORY_NONE,  TERRITORY_NONE,  ""},
            {TERRITORY_NONE,  TERRITORY_NONE,  "R"},
            {TERRITORY_NONE,  TERRITORY_NONE,  "RX"},
            {TERRITORY_NONE,  TERRITORY_NONE,  "RXX"},
            {TERRITORY_RUS,   TERRITORY_NONE,  "RUS"},
            {TERRITORY_NONE,  TERRITORY_NONE,  "RUSSIA"},
            {TERRITORY_USA,   TERRITORY_NONE,  "US"},
            {TERRITORY_USA,   TERRITORY_NONE,  "USA"},
            {TERRITORY_USA,   TERRITORY_NONE,  "usa"},
            {TERRITORY_NONE,  TERRITORY_NONE,  "US-TEST"},
            {TERRITORY_USA,   TERRITORY_NONE,  "US TEST"},
            {TERRITORY_US_CA, TERRITORY_NONE,  "US-CA"},
            {TERRITORY_US_CA, TERRITORY_NONE,  "Us-CA TEST"},
            {TERRITORY_US_CA, TERRITORY_NONE,  "Usa-CA"},
            {TERRITORY_RU_TT, TERRITORY_NONE,  "RUS-TAM"},
            {TERRITORY_NONE,  TERRITORY_NONE,  "RUS-TAMX"},
            {TERRITORY_RU_TT, TERRITORY_NONE,  "RUS-TAM X"},
            {TERRITORY_BR_AL, TERRITORY_NONE,  "AL"},
            {TERRITORY_RU_AL, TERRITORY_RUS,   "AL"}, // 497=rus
            {TERRITORY_RU_AL, TERRITORY_RU_TT, "AL"}, // 431=ru-tam
            {TERRITORY_US_AL, TERRITORY_USA,   "AL"}, // 411=usa
            {TERRITORY_US_AL, TERRITORY_US_CA, "AL"},
            {TERRITORY_NONE,  TERRITORY_NONE,  0}
    };

    static const struct {
        enum Territory input;
        enum Territory output;
    } ptcTestData[] = {
            {TERRITORY_NONE,    TERRITORY_NONE},
            {_TERRITORY_MIN,    TERRITORY_NONE},
            {TERRITORY_VAT,     TERRITORY_NONE},
            {TERRITORY_MX_DIF,  TERRITORY_MEX},
            {TERRITORY_MX_CHH,  TERRITORY_MEX},
            {TERRITORY_GRL,     TERRITORY_NONE},
            {TERRITORY_IN_DD,   TERRITORY_IND},
            {TERRITORY_AU_VIC,  TERRITORY_AUS},
            {TERRITORY_BR_DF,   TERRITORY_BRA},
            {TERRITORY_US_AL,   TERRITORY_USA},
            {TERRITORY_CA_NU,   TERRITORY_CAN},
            {TERRITORY_RU_LIP,  TERRITORY_RUS},
            {TERRITORY_CN_HA,   TERRITORY_CHN},
            {TERRITORY_AAA,     TERRITORY_NONE},
            {_TERRITORY_MAX,    TERRITORY_NONE},
            {TERRITORY_UNKNOWN, TERRITORY_NONE}
    };

    for (i = 0; i < (int) (sizeof(ptcTestData) / sizeof(ptcTestData[0])); i++) {
        enum Territory result = getParentCountryOf(ptcTestData[i].input);
        if (result != ptcTestData[i].output) {
            foundError();
            printf("*** ERROR *** getParentCountryOf(%d) returned unexpected %d\n", ptcTestData[i].input, result);
        }
    }

    for (i = 0; tcTestData[i].inputstring != 0; i++) {
        enum Territory ccode = getTerritoryCode(tcTestData[i].inputstring, tcTestData[i].context);
        ++nrTests;
        if (ccode != tcTestData[i].expectedresult) {
            foundError();
            printf("*** ERROR *** getTerritoryCode(\"%s\", %d)=%d, expected %d\n",
                   tcTestData[i].inputstring, tcTestData[i].context,
                   ccode, tcTestData[i].expectedresult);
        }
    }
    return nrTests;
}